

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall
CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::CLParam
          (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,string *param_name,string *info,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_val)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_name_split;
  undefined1 local_98 [24];
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_CLParam = (_func_int **)&PTR__CLParam_00118cb8;
  __rhs = &this->parameter_name;
  local_58 = &(this->parameter_name).field_2;
  (this->parameter_name)._M_dataplus._M_p = (pointer)local_58;
  pcVar2 = (param_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__rhs,pcVar2,pcVar2 + param_name->_M_string_length);
  this->parameter_name_short = '\0';
  paVar1 = &(this->description).field_2;
  (this->description)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (info->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar2,pcVar2 + info->_M_string_length);
  local_68 = &this->value;
  local_70 = &(this->value).field_2;
  (this->value)._M_dataplus._M_p = (pointer)local_70;
  pcVar2 = (default_val->_M_dataplus)._M_p;
  local_60 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + default_val->_M_string_length);
  (this->default_value)._M_dataplus._M_p = (pointer)&(this->default_value).field_2;
  pcVar2 = (default_val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->default_value,pcVar2,pcVar2 + default_val->_M_string_length);
  this->is_set = false;
  if ((this->description)._M_string_length == 0) {
    std::operator+(&local_50,"No description for ",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    pbVar4 = (pointer)(plVar3 + 2);
    if ((pointer)*plVar3 == pbVar4) {
      local_98._16_8_ = (pbVar4->_M_dataplus)._M_p;
      lStack_80 = plVar3[3];
      local_98._0_8_ = (pointer)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (pbVar4->_M_dataplus)._M_p;
      local_98._0_8_ = (pointer)*plVar3;
    }
    local_98._8_8_ = plVar3[1];
    *plVar3 = (long)pbVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->description,(string *)local_98);
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  CLOptionsHelper::split
            (param_name,',',
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98);
  if (local_98._8_8_ - local_98._0_8_ == 0x40) {
    this->parameter_name_short = *((_Alloc_hider *)local_98._0_8_)->_M_p;
    std::__cxx11::string::_M_assign((string *)__rhs);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  return;
}

Assistant:

CLParam<T>(const std::string& param_name,
               const std::string& info,
               T default_val) :
        parameter_name(param_name), description(info),
        value(default_val), default_value(default_val),
        is_set(false)
    {
        if (description.empty()) description="No description for " + parameter_name + ". I guess you're on your own.";
        std::vector<std::string> param_name_split = CLOptionsHelper::split(param_name, ',') ;
        if (param_name_split.size() == 2) {
            parameter_name_short = param_name_split[0][0] ;
            parameter_name = param_name_split[1] ;
        }
    }